

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall
QOpenGL2PaintEngineExPrivate::stroke(QOpenGL2PaintEngineExPrivate *this,QVectorPath *path,QPen *pen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  ulong uVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  double local_f8;
  undefined8 local_e8;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  QPen local_90 [8];
  undefined1 local_88 [8];
  undefined8 uStack_80;
  int local_78;
  uint uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  CacheEntry *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->q->field_0x8;
  lVar7 = lVar3 + -8;
  if (lVar3 == 0) {
    lVar7 = 0;
  }
  if (this->snapToPixelGrid == true) {
    this->snapToPixelGrid = false;
    this->matrixDirty = true;
  }
  iVar6 = *(int *)(*(long *)pen + 0x18);
  qpen_brush(local_90);
  cVar5 = QBrush::isOpaque();
  if (cVar5 == '\0') {
    bVar4 = false;
  }
  else {
    bVar4 = 0.99 < *(double *)(lVar7 + 0x198);
  }
  transferMode(this,BrushDrawingMode);
  updateMatrix(this);
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_b8 = 0xffffffff;
  uStack_b4 = 0xffffffff;
  uStack_b0 = 0xffffffff;
  uStack_ac = 0xffffffff;
  QTransform::inverted((bool *)local_88);
  lVar3 = *(long *)&this->q->field_0x8;
  lVar7 = lVar3 + -8;
  if (lVar3 == 0) {
    lVar7 = 0;
  }
  if ((*(byte *)(lVar7 + 0x1a0) & 4) == 0) {
    local_d8 = (undefined1  [16])0x0;
    uVar1 = this->width;
    uVar2 = this->height;
    local_c8 = (double)(int)uVar1;
    dStack_c0 = (double)(int)uVar2;
  }
  else {
    QRectF::QRectF((QRectF *)local_d8,(QRect *)(lVar7 + 0x1c4));
  }
  QTransform::mapRect((QRectF *)&local_b8);
  if (iVar6 == 1) {
    QTriangulatingStroker::process(&this->stroker,path,pen);
  }
  else {
    QDashedStrokeProcessor::process(&this->dasher,path,pen,&local_b8);
    local_60 = 0xffffffff;
    uStack_5c = 0xffffffff;
    uStack_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    uStack_70 = 0xffffffff;
    uStack_6c = 0xffffffff;
    uStack_68 = 0xffffffff;
    uStack_64 = 0xffffffff;
    local_50 = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = *(qreal **)&this->field_0x4a8;
    local_78 = *(int *)&this->field_0x4b8;
    local_88 = *(undefined1 (*) [8])&this->field_0x4c0;
    uStack_74 = 7;
    QTriangulatingStroker::process(&this->stroker,(QVectorPath *)local_88,pen);
    QVectorPath::~QVectorPath((QVectorPath *)local_88);
  }
  if ((int)(this->stroker).m_vertices.siz != 0) {
    if (bVar4) {
      prepareForDraw(this,true);
      uploadData(this,0,(this->stroker).m_vertices.buffer,(GLuint)(this->stroker).m_vertices.siz);
      (**(code **)(*(long *)&this->funcs + 0x78))
                (5,0,(long)(int)(this->stroker).m_vertices.siz / 2 & 0xffffffff);
    }
    else {
      dVar11 = *(double *)(*(long *)pen + 8) * 0.5;
      uVar8 = -(ulong)(dVar11 == 0.0);
      local_f8 = (double)(uVar8 & 0x3fe0000000000000 | ~uVar8 & (ulong)dVar11);
      iVar6 = QPen::joinStyle();
      if (iVar6 == 0) {
        dVar11 = (double)QPen::miterLimit();
        if (local_f8 <= dVar11 * local_f8) {
          local_f8 = dVar11 * local_f8;
        }
      }
      cVar5 = QPen::isCosmetic();
      if (cVar5 != '\0') {
        local_f8 = local_f8 * (double)this->inverseScale;
      }
      QVectorPath::controlPointRect();
      fVar12 = (float)((double)local_88 - local_f8);
      fVar13 = (float)((double)uStack_80 - local_f8);
      fVar9 = (float)((double)CONCAT44(uStack_74,local_78) + local_f8 + local_f8 +
                     ((double)local_88 - local_f8));
      fVar10 = (float)((double)CONCAT44(uStack_6c,uStack_70) + local_f8 + local_f8 +
                      ((double)uStack_80 - local_f8));
      local_e8 = (ElementType *)CONCAT44(fVar13,fVar12);
      local_88._4_4_ = fVar13;
      local_88._0_4_ = fVar12;
      uStack_80 = (qreal *)CONCAT44(fVar10,fVar9);
      fillStencilWithVertexArray
                (this,(this->stroker).m_vertices.buffer,(int)(this->stroker).m_vertices.siz / 2,
                 (int *)0x0,0,(QOpenGLRect *)local_88,TriStripStrokeFillMode);
      (**(code **)(*(long *)&this->funcs + 0x138))(0x1e00,0x1e01,0x1e01);
      (**(code **)(*(long *)&this->funcs + 0x128))(0x205,0,0x80);
      prepareForDraw(this,false);
      uStack_80 = (qreal *)CONCAT44(fVar10,fVar9);
      local_88 = (undefined1  [8])local_e8;
      composite(this,(QOpenGLRect *)local_88);
      (**(code **)(*(long *)&this->funcs + 0x130))(0);
      updateClipScissorTest(this);
    }
  }
  QBrush::~QBrush((QBrush *)local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::stroke(const QVectorPath &path, const QPen &pen)
{
    const QOpenGL2PaintEngineState *s = q->state();
    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    const Qt::PenStyle penStyle = qpen_style(pen);
    const QBrush &penBrush = qpen_brush(pen);
    const bool opaque = penBrush.isOpaque() && s->opacity > 0.99;

    transferMode(BrushDrawingMode);

    // updateMatrix() is responsible for setting the inverse scale on
    // the strokers, so we need to call it here and not wait for
    // prepareForDraw() down below.
    updateMatrix();

    QRectF clip = q->state()->matrix.inverted().mapRect(q->state()->clipEnabled
                                                        ? q->state()->rectangleClip
                                                        : QRectF(0, 0, width, height));

    if (penStyle == Qt::SolidLine) {
        stroker.process(path, pen, clip, s->renderHints);

    } else { // Some sort of dash
        dasher.process(path, pen, clip, s->renderHints);

        QVectorPath dashStroke(dasher.points(),
                               dasher.elementCount(),
                               dasher.elementTypes());
        stroker.process(dashStroke, pen, clip, s->renderHints);
    }

    if (!stroker.vertexCount())
        return;

    if (opaque) {
        prepareForDraw(opaque);

        uploadData(QT_VERTEX_COORDS_ATTR, stroker.vertices(), stroker.vertexCount());
        funcs.glDrawArrays(GL_TRIANGLE_STRIP, 0, stroker.vertexCount() / 2);
    } else {
        qreal width = qpen_widthf(pen) / 2;
        if (width == 0)
            width = 0.5;
        qreal extra = pen.joinStyle() == Qt::MiterJoin
                      ? qMax(pen.miterLimit() * width, width)
                      : width;

        if (pen.isCosmetic())
            extra = extra * inverseScale;

        QRectF bounds = path.controlPointRect().adjusted(-extra, -extra, extra, extra);

        fillStencilWithVertexArray(stroker.vertices(), stroker.vertexCount() / 2,
                                      nullptr, 0, bounds, QOpenGL2PaintEngineExPrivate::TriStripStrokeFillMode);

        funcs.glStencilOp(GL_KEEP, GL_REPLACE, GL_REPLACE);

        // Pass when any bit is set, replace stencil value with 0
        funcs.glStencilFunc(GL_NOTEQUAL, 0, GL_STENCIL_HIGH_BIT);
        prepareForDraw(false);

        // Stencil the brush onto the dest buffer
        composite(bounds);

        funcs.glStencilMask(0);

        updateClipScissorTest();
    }
}